

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void recff_bit64_tobit(jit_State *J,RecordFFData *rd)

{
  TRef local_54;
  TRef tr;
  CTState *cts;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  local_54 = crec_ct_tv(J,(CType *)(*(long *)J[-1].penalty[0x3b].pc.ptr64 + 0x108),0,*J->base,
                        rd->argv);
  if (4 < (local_54 >> 0x18 & 0x1f) - 0xf) {
    (J->fold).ins.field_0.ot = 0x5b13;
    (J->fold).ins.field_0.op1 = (IRRef1)local_54;
    (J->fold).ins.field_0.op2 = (byte)(local_54 >> 0x18) & 0x1f | 0x260;
    local_54 = lj_opt_fold(J);
  }
  *J->base = local_54;
  return;
}

Assistant:

void LJ_FASTCALL recff_bit64_tobit(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  TRef tr = crec_ct_tv(J, ctype_get(cts, CTID_INT64), 0,
		       J->base[0], &rd->argv[0]);
  if (!tref_isinteger(tr))
    tr = emitconv(tr, IRT_INT, tref_type(tr), 0);
  J->base[0] = tr;
}